

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStepCompatibleWithAdjointSolver
              (ARKodeMem ark_mem,ARKodeARKStepMem step_mem,int lineno,char *fname,char *filename)

{
  char *msgfmt;
  
  if (ark_mem->fixedstep == 0) {
    msgfmt = "ARKStep must be using a fixed step to work with SUNAdjointStepper";
  }
  else if (step_mem->fi == (ARKRhsFn)0x0) {
    if (step_mem->fe == (ARKRhsFn)0x0) {
      msgfmt = "SUNAdjointStepper requires fe != NULL (it only supports explicit RK methods)";
    }
    else if (ark_mem->relax_enabled == 0) {
      if (step_mem->mass_type == 0) {
        if (ark_mem->constraintsSet == 0) {
          return 0;
        }
        msgfmt = "SUNAdjointStepper is not compatible with constraints";
      }
      else {
        msgfmt = "SUNAdjointStepper is not compatible with non-identity mass matrices";
      }
    }
    else {
      msgfmt = "SUNAdjointStepper is not compatible with relaxation";
    }
  }
  else {
    msgfmt = "SUNAdjointStepper requires fi = NULL (it only supports explicit RK methods)";
  }
  arkProcessError(ark_mem,-0x16,lineno,fname,filename,msgfmt);
  return -0x16;
}

Assistant:

int arkStepCompatibleWithAdjointSolver(ARKodeMem ark_mem,
                                       ARKodeARKStepMem step_mem, int lineno,
                                       const char* fname, const char* filename)
{
  if (!ark_mem->fixedstep)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname,
                    filename, "ARKStep must be using a fixed step to work with SUNAdjointStepper");
    return ARK_ILL_INPUT;
  }

  if (step_mem->fi)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname,
                    filename, "SUNAdjointStepper requires fi = NULL (it only supports explicit RK methods)");
    return ARK_ILL_INPUT;
  }

  if (!step_mem->fe)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname,
                    filename, "SUNAdjointStepper requires fe != NULL (it only supports explicit RK methods)");
    return ARK_ILL_INPUT;
  }

  if (ark_mem->relax_enabled)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname, filename,
                    "SUNAdjointStepper is not compatible with relaxation");
    return ARK_ILL_INPUT;
  }

  if (step_mem->mass_type != MASS_IDENTITY)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname,
                    filename, "SUNAdjointStepper is not compatible with non-identity mass matrices");
    return ARK_ILL_INPUT;
  }

  if (ark_mem->constraintsSet)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname, filename,
                    "SUNAdjointStepper is not compatible with constraints");
    return ARK_ILL_INPUT;
  }

  return ARK_SUCCESS;
}